

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RadiusThrust
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  ActorFlags2 *pAVar1;
  int fulldamagedistance;
  uint uVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  int bombdamage;
  AActor *bombspot;
  int iVar6;
  AActor *bombsource;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  FName local_2c;
  PClass *pPVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003cad2f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003cad1f:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cad2f:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x530,
                  "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bombspot = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (bombspot == (AActor *)0x0) goto LAB_003cab96;
    pPVar5 = (bombspot->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(bombspot->super_DThinker).super_DObject._vptr_DObject)(bombspot);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (bombspot->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar12 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar12) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar12 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar12) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cad2f;
    }
  }
  else {
    if (bombspot != (AActor *)0x0) goto LAB_003cad1f;
LAB_003cab96:
    bombspot = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cad9e:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x531,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[1].field_0.i;
LAB_003cabe5:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cadbd:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x532,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[2].field_0.i;
LAB_003cabf4:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cad6d:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x533,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar9 = param[3].field_0.i;
LAB_003cac03:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cad4e:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x534,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cad9e;
    }
    iVar4 = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003cabe5;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cadbd;
    }
    iVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003cabf4;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cad6d;
    }
    uVar9 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003cac03;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cad4e;
    }
  }
  fulldamagedistance = param[4].field_0.i;
  bombdamage = 0x80;
  if (iVar4 != 0) {
    bombdamage = iVar4;
  }
  iVar4 = -bombdamage;
  if (0 < bombdamage) {
    iVar4 = bombdamage;
  }
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  bombsource = (bombspot->target).field_0.p;
  if ((uVar9 & 4) == 0) {
    if (bombsource != (AActor *)0x0) {
      if (((bombsource->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        uVar2 = (bombsource->flags2).Value;
        uVar7 = uVar2 & 0x20000;
        cVar10 = (char)(uVar7 >> 0x11);
        if (uVar7 != 0) {
          (bombsource->flags2).Value = uVar2 & 0xfffdffff;
        }
        goto LAB_003cac7d;
      }
      (bombspot->target).field_0.p = (AActor *)0x0;
    }
    cVar11 = '\0';
  }
  else {
    cVar11 = '\0';
    cVar10 = '\0';
    if (bombsource != (AActor *)0x0) {
LAB_003cac7d:
      cVar11 = cVar10;
      if (((bombsource->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003caca3;
      (bombspot->target).field_0.p = (AActor *)0x0;
    }
  }
  bombsource = (AActor *)0x0;
LAB_003caca3:
  local_2c.Index = (bombspot->DamageType).super_FName.Index;
  P_RadiusAttack(bombspot,bombsource,bombdamage,iVar4,&local_2c,uVar9 | 8,fulldamagedistance);
  P_CheckSplash(bombspot,(double)iVar4);
  if (cVar11 != '\0') {
    pAVar1 = &((bombspot->target).field_0.p)->flags2;
    pAVar1->Value = pAVar1->Value | 0x20000;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusThrust)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(force);
	PARAM_INT_DEF	(distance);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(fullthrustdistance);

	bool sourcenothrust = false;

	if (force == 0) force = 128;
	if (distance <= 0) distance = abs(force);

	// Temporarily negate MF2_NODMGTHRUST on the shooter, since it renders this function useless.
	if (!(flags & RTF_NOTMISSILE) && self->target != NULL && self->target->flags2 & MF2_NODMGTHRUST)
	{
		sourcenothrust = true;
		self->target->flags2 &= ~MF2_NODMGTHRUST;
	}

	P_RadiusAttack (self, self->target, force, distance, self->DamageType, flags | RADF_NODAMAGE, fullthrustdistance);
	P_CheckSplash(self, distance);

	if (sourcenothrust)
	{
		self->target->flags2 |= MF2_NODMGTHRUST;
	}
	return 0;
}